

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fraClass.c
# Opt level: O3

void Fra_PrintClass(Fra_Cla_t *p,Aig_Obj_t **pClass)

{
  uint uVar1;
  uint uVar2;
  uint uVar3;
  Aig_Obj_t **ppAVar4;
  Aig_Obj_t *pAVar5;
  
  pAVar5 = pClass[1];
  if (pAVar5 != (Aig_Obj_t *)0x0) {
    ppAVar4 = pClass + 2;
    do {
      if (*(Aig_Obj_t **)
           (*(long *)(*(long *)((long)(pAVar5->field_5).pData + 0x30) + 8) + (long)pAVar5->Id * 8)
          != *pClass) {
        __assert_fail("Fra_ClassObjRepr(pTemp) == pClass[0]",
                      "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/proof/fra/fraClass.c"
                      ,0xda,"void Fra_PrintClass(Fra_Cla_t *, Aig_Obj_t **)");
      }
      pAVar5 = *ppAVar4;
      ppAVar4 = ppAVar4 + 1;
    } while (pAVar5 != (Aig_Obj_t *)0x0);
  }
  printf("{ ");
  pAVar5 = *pClass;
  if (pAVar5 != (Aig_Obj_t *)0x0) {
    ppAVar4 = pClass + 1;
    do {
      uVar1 = pAVar5->Id;
      uVar2 = *(uint *)&pAVar5->field_0x1c;
      uVar3 = Aig_SupportSize(p->pAig,pAVar5);
      printf("%d(%d,%d) ",(ulong)uVar1,(ulong)(uVar2 & 0xffffff),(ulong)uVar3);
      pAVar5 = *ppAVar4;
      ppAVar4 = ppAVar4 + 1;
    } while (pAVar5 != (Aig_Obj_t *)0x0);
  }
  puts("}");
  return;
}

Assistant:

void Fra_PrintClass( Fra_Cla_t * p, Aig_Obj_t ** pClass )
{
    Aig_Obj_t * pTemp;
    int i;
    for ( i = 1; (pTemp = pClass[i]); i++ )
        assert( Fra_ClassObjRepr(pTemp) == pClass[0] );
    printf( "{ " );
    for ( i = 0; (pTemp = pClass[i]); i++ )
        printf( "%d(%d,%d) ", pTemp->Id, pTemp->Level, Aig_SupportSize(p->pAig,pTemp) );
    printf( "}\n" );
}